

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.c
# Opt level: O3

void move_print(Board *board,Move *move,_Bool indent)

{
  MOVETYPE MVar1;
  byte bVar2;
  uint uVar3;
  Spot *pSVar4;
  Spot *pSVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  char local_438 [1032];
  
  if (move->type == MULTIPLE) {
LAB_00106919:
    uVar9 = 0x20;
    if (indent) {
      uVar9 = 9;
    }
    printf("%c      MULTIPLE\n",uVar9);
    movePack_print(board,move->movePack,true);
    return;
  }
  pSVar4 = board_spotGet(board,move->fromSpotType,move->fromSpotIndex);
  if (move->type < MOVEDISTRIBUTE) {
    pSVar5 = board_spotGet(board,move->toSpotType,move->toSpotIndex);
  }
  else {
    pSVar5 = (Spot *)0x0;
  }
  uVar10 = 0;
  if ((pSVar4 != (Spot *)0x0) &&
     (uVar10 = (ulong)(uint)move->fromSpotCardIndex, move->fromSpotCardIndex == 0xffffffff)) {
    uVar10 = (ulong)(pSVar4->cardsCount - 1);
  }
  bVar13 = true;
  if (pSVar5 == (Spot *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = pSVar5->cardsCount - 1;
    if (move->toSpotCardIndex != 0xffffffff) {
      uVar12 = move->toSpotCardIndex;
    }
    if (pSVar5->cardsCount != 0) {
      bVar13 = pSVar5->cards[(ulong)uVar12 & 0xff] == (Card *)0x0;
    }
  }
  MVar1 = move->type;
  uVar11 = (ulong)MVar1;
  if (MVar1 == MOVE) {
    if (pSVar4 != (Spot *)0x0) goto LAB_00106b31;
    uVar11 = 0;
  }
  else {
    if (MVar1 == MOVEREVERSED && pSVar4 != (Spot *)0x0) {
LAB_00106b31:
      pcVar6 = cards_print((Card **)((ulong)(((uint)uVar10 & 0xff) * 8) + (long)pSVar4->cards),
                           pSVar4->cardsCount - (char)uVar10,false);
      if (bVar13) {
        pcVar7 = "TOP";
      }
      else {
        pcVar7 = cards_print((Card **)((ulong)((uVar12 & 0xff) * 8) + (long)pSVar5->cards),
                             pSVar5->cardsCount - (char)uVar12,false);
      }
      sprintf(local_438,"%s => %s",pcVar6,pcVar7);
      uVar12 = 0x20;
      if (indent) {
        uVar12 = 9;
      }
      pcVar6 = spot_name(move->fromSpotType);
      bVar2 = move->fromSpotIndex;
      uVar3 = move->fromSpotCardIndex;
      pcVar7 = spot_name(move->toSpotType);
      pcVar8 = "";
      if (move->type == MOVEREVERSED) {
        pcVar8 = "(reversed)";
      }
      printf("%c          MOVE %10s%02d %2d => %10s%02d   %2d %s (%s)\n",(ulong)uVar12,pcVar6,
             (ulong)bVar2,(ulong)uVar3,pcVar7,(ulong)move->toSpotIndex,
             (ulong)(uint)move->toSpotCardIndex,pcVar8,local_438);
      return;
    }
    if (MVar1 == MOVEDISTRIBUTE && pSVar4 != (Spot *)0x0) {
      pcVar6 = spot_name(move->fromSpotType);
      bVar2 = move->fromSpotIndex;
      uVar12 = move->fromSpotCardIndex;
      pcVar7 = spot_name(move->toSpotType);
      uVar9 = 0x20;
      if (indent) {
        uVar9 = 9;
      }
      printf("%cMOVEDISTRIBUTE %10s%02d %2d => %10s0-%02d %2d (",uVar9,pcVar6,(ulong)bVar2,
             (ulong)uVar12,pcVar7,(ulong)(move->toSpotIndex - 1),(ulong)(uint)move->toSpotCardIndex)
      ;
      if (move->toSpotIndex != '\0') {
        uVar10 = uVar10 & 0xff;
        uVar12 = 0;
        do {
          if (uVar12 != 0) {
            printf(", ");
          }
          pSVar5 = board_spotGet(board,move->toSpotType,(uchar)uVar12);
          pcVar6 = card_print(pSVar4->cards[uVar10],false);
          pcVar7 = "TOP";
          if (pSVar5->cardsCount != 0) {
            pcVar7 = card_print(pSVar5->cards[pSVar5->cardsCount - 1],false);
          }
          printf("%s => %s",pcVar6,pcVar7);
          uVar12 = uVar12 + 1;
          uVar10 = uVar10 - 1;
        } while (uVar12 < move->toSpotIndex);
      }
      puts(")");
      return;
    }
    if (MVar1 == MULTIPLE) goto LAB_00106919;
  }
  pcVar6 = spot_name(move->fromSpotType);
  bVar2 = move->fromSpotIndex;
  uVar12 = move->fromSpotCardIndex;
  pcVar7 = spot_name(move->toSpotType);
  printf("Unknown or invalid formatted move %d %s-%d:%d %s-%d:%d\n",uVar11,pcVar6,(ulong)bVar2,
         (ulong)uVar12,pcVar7,(ulong)move->toSpotIndex,(ulong)(uint)move->toSpotCardIndex);
  return;
}

Assistant:

void move_print(Board * board, Move * move, bool indent)
{
	char buf[1024];
	Spot * fromSpot = (move->type==MULTIPLE ? 0 : board_spotGet(board, move->fromSpotType, move->fromSpotIndex));
	Spot * toSpot = (move->type==MOVE || move->type==MOVEREVERSED ? board_spotGet(board, move->toSpotType, move->toSpotIndex) : 0);
	unsigned char fromSpotCardIndex = (fromSpot==0 ? 0 : (move->fromSpotCardIndex==-1 ? (fromSpot->cardsCount-1) : move->fromSpotCardIndex));
	unsigned char toSpotCardIndex = (toSpot==0 ? 0 : (move->toSpotCardIndex==-1 ? (toSpot->cardsCount-1) : move->toSpotCardIndex));
	unsigned char i=0;
	Card * toCard = (toSpot==0 ? 0 : (toSpot->cardsCount==0 ? 0 : toSpot->cards[toSpotCardIndex]));

	if((move->type==MOVE || move->type==MOVEREVERSED) && fromSpot)
	{
		sprintf(buf, "%s => %s", cards_print(&fromSpot->cards[fromSpotCardIndex], fromSpot->cardsCount-fromSpotCardIndex, false), toCard==0 ? "TOP" : cards_print(&toSpot->cards[toSpotCardIndex], toSpot->cardsCount-toSpotCardIndex, false));
		printf("%c          MOVE %10s%02d %2d => %10s%02d   %2d %s (%s)\n", (indent ? '\t' : ' '), spot_name(move->fromSpotType), move->fromSpotIndex, move->fromSpotCardIndex, spot_name(move->toSpotType), move->toSpotIndex, move->toSpotCardIndex, move->type==MOVEREVERSED ? "(reversed)" : "", buf);	
	}
	else if(move->type==MOVEDISTRIBUTE && fromSpot)
	{
		printf("%cMOVEDISTRIBUTE %10s%02d %2d => %10s0-%02d %2d (", (indent ? '\t' : ' '), spot_name(move->fromSpotType), move->fromSpotIndex, move->fromSpotCardIndex, spot_name(move->toSpotType), move->toSpotIndex-1, move->toSpotCardIndex);

		buf[0] = 0;
		for(i=0;i<move->toSpotIndex;i++)
		{
			if(i>0)
				printf(", ");

			toSpot = board_spotGet(board, move->toSpotType, i);
			printf("%s => %s", card_print(fromSpot->cards[(fromSpotCardIndex-i)], false), toSpot->cardsCount==0 ? "TOP" : (card_print(toSpot->cards[(toSpot->cardsCount-1)], false)));
		}
		printf(")\n");
	}
	else if(move->type==MULTIPLE)
	{
		printf("%c      MULTIPLE\n", (indent ? '\t' : ' '));
		movePack_print(board, move->movePack, true);
	}
	else
	{
		printf("Unknown or invalid formatted move %d %s-%d:%d %s-%d:%d\n", move->type, spot_name(move->fromSpotType), move->fromSpotIndex, move->fromSpotCardIndex, spot_name(move->toSpotType), move->toSpotIndex, move->toSpotCardIndex);
	}
}